

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Imputer::ByteSizeLong(Imputer *this)

{
  ImputedValueCase IVar1;
  ReplaceValueCase RVar2;
  int iVar3;
  int64 iVar4;
  string *psVar5;
  size_t sVar6;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  Imputer *this_local;
  
  sStack_18 = 0;
  IVar1 = ImputedValue_case(this);
  switch(IVar1) {
  case IMPUTEDVALUE_NOT_SET:
    break;
  case kImputedDoubleValue:
    sStack_18 = 9;
    break;
  case kImputedInt64Value:
    iVar4 = imputedint64value(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar4);
    sStack_18 = sStack_18 + 1;
    break;
  case kImputedStringValue:
    psVar5 = imputedstringvalue_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sStack_18 + 1;
    break;
  case kImputedDoubleArray:
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::DoubleVector>
                          ((this->ImputedValue_).imputeddoublearray_);
    sStack_18 = sStack_18 + 1;
    break;
  case kImputedInt64Array:
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                          ((this->ImputedValue_).imputedint64array_);
    sStack_18 = sStack_18 + 1;
    break;
  case kImputedStringDictionary:
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::StringToDoubleMap>
                          ((this->ImputedValue_).imputedstringdictionary_);
    sStack_18 = sStack_18 + 1;
    break;
  case kImputedInt64Dictionary:
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::Int64ToDoubleMap>
                          ((this->ImputedValue_).imputedint64dictionary_);
    sStack_18 = sStack_18 + 1;
  }
  RVar2 = ReplaceValue_case(this);
  switch(RVar2) {
  case REPLACEVALUE_NOT_SET:
    break;
  case kReplaceDoubleValue:
    sStack_18 = sStack_18 + 9;
    break;
  case kReplaceInt64Value:
    iVar4 = replaceint64value(this);
    sVar6 = google::protobuf::internal::WireFormatLite::Int64Size(iVar4);
    sStack_18 = sVar6 + 1 + sStack_18;
    break;
  case kReplaceStringValue:
    psVar5 = replacestringvalue_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t Imputer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Imputer)
  size_t total_size = 0;

  switch (ImputedValue_case()) {
    // double imputedDoubleValue = 1;
    case kImputedDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 imputedInt64Value = 2;
    case kImputedInt64Value: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->imputedint64value());
      break;
    }
    // string imputedStringValue = 3;
    case kImputedStringValue: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->imputedstringvalue());
      break;
    }
    // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
    case kImputedDoubleArray: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputeddoublearray_);
      break;
    }
    // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
    case kImputedInt64Array: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedint64array_);
      break;
    }
    // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
    case kImputedStringDictionary: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedstringdictionary_);
      break;
    }
    // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
    case kImputedInt64Dictionary: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ImputedValue_.imputedint64dictionary_);
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (ReplaceValue_case()) {
    // double replaceDoubleValue = 11;
    case kReplaceDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // int64 replaceInt64Value = 12;
    case kReplaceInt64Value: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->replaceint64value());
      break;
    }
    // string replaceStringValue = 13;
    case kReplaceStringValue: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}